

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O0

void Bmc_CexEssentialBitTest(Gia_Man_t *p,Abc_Cex_t *pCexState)

{
  int nInputs;
  Abc_Cex_t *pCex;
  Gia_Obj_t *pGVar1;
  int local_24;
  int b;
  Abc_Cex_t *pNew;
  Abc_Cex_t *pCexState_local;
  Gia_Man_t *p_local;
  
  for (local_24 = 0; local_24 < pCexState->nBits; local_24 = local_24 + 1) {
    if (local_24 % 100 == 0) {
      pCex = Bmc_CexEssentialBitOne(p,pCexState,local_24,(Abc_Cex_t *)0x0,(int *)0x0);
      nInputs = Gia_ManPiNum(p);
      Bmc_CexPrint(pCex,nInputs,0);
      pGVar1 = Gia_ManPo(p,pCexState->iPo);
      if ((*(ulong *)pGVar1 >> 0x3e & 1) == 0) {
        printf("Essential\n");
      }
      else {
        printf("Not essential\n");
      }
      Abc_CexFree(pCex);
    }
  }
  return;
}

Assistant:

void Bmc_CexEssentialBitTest( Gia_Man_t * p, Abc_Cex_t * pCexState )
{
    Abc_Cex_t * pNew;
    int b;
    for ( b = 0; b < pCexState->nBits; b++ )
    {
        if ( b % 100 )
            continue;
        pNew = Bmc_CexEssentialBitOne( p, pCexState, b, NULL, NULL );
        Bmc_CexPrint( pNew, Gia_ManPiNum(p), 0 );

        if ( Gia_ManPo(p, pCexState->iPo)->fMark1 )
            printf( "Not essential\n" );
        else
            printf( "Essential\n" );

        Abc_CexFree( pNew );
    }
}